

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmn_live.c
# Opt level: O0

void cmn_live_update(cmn_t *cmn)

{
  int iVar1;
  char *pcVar2;
  int local_18;
  int32 i;
  mfcc_t sf;
  cmn_t *cmn_local;
  
  if (0 < cmn->nframe) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/cmn_live.c"
            ,0x5f,"Update from < %s >\n",cmn->repr);
    iVar1 = cmn->nframe;
    for (local_18 = 0; local_18 < cmn->veclen; local_18 = local_18 + 1) {
      cmn->cmn_mean[local_18] = (mfcc_t)((float)cmn->sum[local_18] / (float)cmn->nframe);
    }
    if (800 < cmn->nframe) {
      for (local_18 = 0; local_18 < cmn->veclen; local_18 = local_18 + 1) {
        cmn->sum[local_18] = (mfcc_t)((float)cmn->sum[local_18] * (1.0 / (float)iVar1) * 500.0);
      }
      cmn->nframe = 500;
    }
    pcVar2 = cmn_update_repr(cmn);
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/cmn_live.c"
            ,0x6c,"Update to   < %s >\n",pcVar2);
  }
  return;
}

Assistant:

void
cmn_live_update(cmn_t *cmn)
{
    mfcc_t sf;
    int32 i;

    if (cmn->nframe <= 0)
        return;

    E_INFO("Update from < %s >\n", cmn->repr);
    /* Update mean buffer */
    sf = FLOAT2MFCC(1.0) / cmn->nframe;
    for (i = 0; i < cmn->veclen; i++)
        cmn->cmn_mean[i] = cmn->sum[i] / cmn->nframe; /* sum[i] * sf; */

    /* Make the accumulation decay exponentially */
    if (cmn->nframe > CMN_WIN_HWM) {
        sf = CMN_WIN * sf;
        for (i = 0; i < cmn->veclen; i++)
            cmn->sum[i] = MFCCMUL(cmn->sum[i], sf);
        cmn->nframe = CMN_WIN;
    }
    E_INFO("Update to   < %s >\n", cmn_update_repr(cmn));
}